

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_a94b9c::TargetSourcesImpl::HandleDirectContent
          (TargetSourcesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  optional<cmListFileBacktrace> local_98;
  string local_78;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"SOURCES","",CONCAT71(in_register_00000009,param_3),
             CONCAT71(in_register_00000081,param_4));
  ConvertToAbsoluteContent(&local_38,this,tgt,content,No,Yes);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])
            (&local_58,this,&local_38);
  cmMakefile::GetBacktrace((this->super_cmTargetPropCommandBase).Makefile);
  local_98.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
  super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
  super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)_Stack_a0._M_pi;
  local_98.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
  super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
  super__Optional_payload_base<cmListFileBacktrace>._M_engaged = true;
  cmTarget::AppendProperty(tgt,&local_78,&local_58,&local_98,false);
  if ((local_98.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
       super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
       super__Optional_payload_base<cmListFileBacktrace>._M_engaged == true) &&
     (local_98.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
      super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
      super__Optional_payload_base<cmListFileBacktrace>._M_engaged = false,
     local_98.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
     super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
     super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
     super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_98.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
               super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
               super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
               super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    tgt->AppendProperty("SOURCES",
                        this->Join(this->ConvertToAbsoluteContent(
                          tgt, content, IsInterface::No, CheckCMP0076::Yes)),
                        this->Makefile->GetBacktrace());
    return true; // Successfully handled.
  }